

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O1

void __thiscall
cmCommandArgumentsHelper::Parse
          (cmCommandArgumentsHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unconsumedArgs)

{
  pointer ppcVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  cmCommandArgument *pcVar5;
  pointer ppcVar6;
  cmCommandArgument *pcVar7;
  cmCommandArgument *current;
  string *it;
  pointer __x;
  vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *__range1;
  
  if (args != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    ppcVar1 = (this->Arguments).
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar6 = (this->Arguments).
                   super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
        ppcVar6 = ppcVar6 + 1) {
      pcVar5 = *ppcVar6;
      cmCommandArgument::ApplyOwnGroup(pcVar5);
      pcVar5->WasActive = false;
      pcVar5->CurrentIndex = 0;
      (*pcVar5->_vptr_cmCommandArgument[3])(pcVar5);
    }
    __x = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__x != pbVar2) {
      pcVar5 = (cmCommandArgument *)0x0;
      current = (cmCommandArgument *)0x0;
      do {
        ppcVar6 = (this->Arguments).
                  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        ppcVar1 = (this->Arguments).
                  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar7 = pcVar5;
        do {
          if (ppcVar1 == ppcVar6) break;
          pcVar5 = *ppcVar1;
          if ((((pcVar5->Key == (char *)0x0) || (*pcVar5->Key == '\0')) ||
              (iVar4 = std::__cxx11::string::compare((char *)__x), iVar4 == 0)) &&
             (bVar3 = cmCommandArgument::MayFollow(pcVar5,current), bVar3)) {
            pcVar5->WasActive = true;
            pcVar5->CurrentIndex = 0;
            bVar3 = true;
            pcVar7 = pcVar5;
          }
          else {
            bVar3 = false;
          }
          ppcVar1 = ppcVar1 + 1;
        } while (!bVar3);
        if (pcVar7 == (cmCommandArgument *)0x0) {
          if (unconsumedArgs !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(unconsumedArgs,__x);
          }
          pcVar5 = (cmCommandArgument *)0x0;
          pcVar7 = current;
        }
        else {
          iVar4 = (*pcVar7->_vptr_cmCommandArgument[2])(pcVar7,__x,(ulong)pcVar7->CurrentIndex);
          pcVar7->CurrentIndex = pcVar7->CurrentIndex + 1;
          pcVar5 = (cmCommandArgument *)0x0;
          if ((char)iVar4 == '\0') {
            pcVar5 = pcVar7;
          }
        }
        __x = __x + 1;
        current = pcVar7;
      } while (__x != pbVar2);
    }
  }
  return;
}

Assistant:

void cmCommandArgumentsHelper::Parse(const std::vector<std::string>* args,
                                     std::vector<std::string>* unconsumedArgs)
{
  if (args == nullptr) {
    return;
  }

  for (cmCommandArgument* ca : this->Arguments) {
    ca->ApplyOwnGroup();
    ca->Reset();
  }

  cmCommandArgument* activeArgument = nullptr;
  const cmCommandArgument* previousArgument = nullptr;
  for (std::string const& it : *args) {
    for (cmCommandArgument* ca : this->Arguments) {
      if (ca->KeyMatches(it) && (ca->MayFollow(previousArgument))) {
        activeArgument = ca;
        activeArgument->Activate();
        break;
      }
    }

    if (activeArgument) {
      bool argDone = activeArgument->Consume(it);
      previousArgument = activeArgument;
      if (argDone) {
        activeArgument = nullptr;
      }
    } else {
      if (unconsumedArgs != nullptr) {
        unconsumedArgs->push_back(it);
      }
    }
  }
}